

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

void satoko_write_dimacs(satoko_t *s,char *fname,int wrt_lrnt,int zero_var)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  clause_conflict *pcVar5;
  uint local_74;
  uint local_64;
  uint local_54;
  uint *array;
  uint n_lrnts;
  uint n_orig;
  uint n_vars;
  uint i;
  FILE *file;
  int zero_var_local;
  int wrt_lrnt_local;
  char *fname_local;
  satoko_t *s_local;
  
  uVar2 = vec_sdbl_size(s->activity);
  local_54 = vec_uint_size(s->originals);
  uVar3 = vec_uint_size(s->trail);
  local_54 = local_54 + uVar3;
  uVar3 = vec_uint_size(s->learnts);
  if ((wrt_lrnt != 0) && (wrt_lrnt != 1)) {
    __assert_fail("wrt_lrnt == 0 || wrt_lrnt == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x250,"void satoko_write_dimacs(satoko_t *, char *, int, int)");
  }
  if ((zero_var != 0) && (zero_var != 1)) {
    __assert_fail("zero_var == 0 || zero_var == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x251,"void satoko_write_dimacs(satoko_t *, char *, int, int)");
  }
  if (fname == (char *)0x0) {
    _n_vars = _stdout;
  }
  else {
    _n_vars = fopen(fname,"w");
  }
  if (_n_vars == (FILE *)0x0) {
    printf("Error: Cannot open output file.\n");
  }
  else {
    if (wrt_lrnt != 0) {
      local_54 = local_54 + uVar3;
    }
    fprintf(_n_vars,"p cnf %d %d\n",(ulong)uVar2,(ulong)local_54);
    for (n_orig = 0; uVar2 = vec_char_size(s->assigns), n_orig < uVar2; n_orig = n_orig + 1) {
      cVar1 = var_value(s,n_orig);
      if (cVar1 != '\x03') {
        if (zero_var == 0) {
          cVar1 = var_value(s,n_orig);
          if (cVar1 == '\x01') {
            local_74 = -(n_orig + 1);
          }
          else {
            local_74 = n_orig + 1;
          }
          fprintf(_n_vars,"%d 0\n",(ulong)local_74);
        }
        else {
          cVar1 = var_value(s,n_orig);
          if (cVar1 == '\x01') {
            local_64 = -n_orig;
          }
          else {
            local_64 = n_orig;
          }
          fprintf(_n_vars,"%d\n",(ulong)local_64);
        }
      }
    }
    puVar4 = vec_uint_data(s->originals);
    for (n_orig = 0; uVar2 = vec_uint_size(s->originals), n_orig < uVar2; n_orig = n_orig + 1) {
      pcVar5 = clause_fetch(s,puVar4[n_orig]);
      clause_dump((FILE *)_n_vars,pcVar5,(uint)((zero_var != 0 ^ 0xffU) & 1));
    }
    if (wrt_lrnt != 0) {
      puVar4 = vec_uint_data(s->learnts);
      for (n_orig = 0; n_orig < uVar3; n_orig = n_orig + 1) {
        pcVar5 = clause_fetch(s,puVar4[n_orig]);
        clause_dump((FILE *)_n_vars,pcVar5,(uint)((zero_var != 0 ^ 0xffU) & 1));
      }
    }
    fclose(_n_vars);
  }
  return;
}

Assistant:

void satoko_write_dimacs(satoko_t *s, char *fname, int wrt_lrnt, int zero_var)
{
    FILE *file;
    unsigned i;
    unsigned n_vars = vec_act_size(s->activity);
    unsigned n_orig = vec_uint_size(s->originals) + vec_uint_size(s->trail);
    unsigned n_lrnts = vec_uint_size(s->learnts);
    unsigned *array;

    assert(wrt_lrnt == 0 || wrt_lrnt == 1);
    assert(zero_var == 0 || zero_var == 1);
    if (fname != NULL)
        file = fopen(fname, "w");
    else
        file = stdout;
    
    if (file == NULL) {
        printf( "Error: Cannot open output file.\n");
        return;
    }
    fprintf(file, "p cnf %d %d\n", n_vars, wrt_lrnt ? n_orig + n_lrnts : n_orig);
    for (i = 0; i < vec_char_size(s->assigns); i++) {
        if ( var_value(s, i) != SATOKO_VAR_UNASSING ) {
            if (zero_var)
                fprintf(file, "%d\n", var_value(s, i) == SATOKO_LIT_FALSE ? -(int)(i) : i);
            else
                fprintf(file, "%d 0\n", var_value(s, i) == SATOKO_LIT_FALSE ? -(int)(i + 1) : i + 1);
        }
    }
    array = vec_uint_data(s->originals);
    for (i = 0; i < vec_uint_size(s->originals); i++)
        clause_dump(file, clause_fetch(s, array[i]), !zero_var);
    
    if (wrt_lrnt) {
        array = vec_uint_data(s->learnts);
        for (i = 0; i < n_lrnts; i++)
            clause_dump(file, clause_fetch(s, array[i]), !zero_var);
    }
    fclose(file);

}